

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Timing.cpp
# Opt level: O2

void __thiscall soul::CPULoadMeasurer::stopMeasurement(CPULoadMeasurer *this)

{
  double dVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = std::chrono::_V2::system_clock::now();
  if ((this->previousEnd).__d.__r != 0) {
    lVar3 = std::chrono::_V2::system_clock::now();
    dVar1 = (((double)((lVar3 - (this->currentStart).__d.__r) / 1000) / 1000000.0) /
             ((double)((lVar2 - (this->previousEnd).__d.__r) / 1000) / 1000000.0) -
            this->runningProportion) * 0.2 + this->runningProportion;
    this->runningProportion = dVar1;
    LOCK();
    (this->currentLoad)._M_i = (float)dVar1;
    UNLOCK();
  }
  (this->previousEnd).__d.__r = lVar2;
  return;
}

Assistant:

void CPULoadMeasurer::stopMeasurement()
{
   #if ! JUCE_BELA
    auto now = clock::now();

    if (previousEnd != clock::time_point())
    {
        auto thisLength   = toSeconds (clock::now() - currentStart);
        auto totalPeriod  = toSeconds (now - previousEnd);

        auto proportion = thisLength / totalPeriod;

        const double filterAmount = 0.2;
        runningProportion += filterAmount * (proportion - runningProportion);
        currentLoad = (float) runningProportion;
    }

    previousEnd = now;
   #endif
}